

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

CURLcode glob_url(URLGlob **glob,char *url,unsigned_long *urlnum,FILE *error)

{
  URLPattern *pUVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  FILE *pFVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  char *pcVar14;
  URLGlob *glob_00;
  long lVar15;
  char **ppcVar16;
  char *__dest;
  int *piVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  anon_union_40_3_e2f18bb4_for_content *paVar23;
  CURLcode CVar24;
  anon_union_40_3_e2f18bb4_for_content *paVar25;
  byte *pbVar26;
  char cVar27;
  int iVar28;
  ulong uVar29;
  anon_union_40_3_e2f18bb4_for_content *paVar30;
  ulong local_2a0;
  byte *local_290;
  char max_c;
  char min_c;
  anon_union_40_3_e2f18bb4_for_content *local_280;
  char end_c;
  anon_union_40_3_e2f18bb4_for_content *local_270;
  int local_264;
  URLPattern *local_260;
  FILE *local_258;
  unsigned_long *local_250;
  byte *local_248;
  URLGlob **local_240;
  char hostname [128];
  
  *glob = (URLGlob *)0x0;
  local_258 = error;
  local_250 = urlnum;
  local_248 = (byte *)url;
  sVar13 = strlen(url);
  pcVar14 = (char *)malloc(sVar13 + 1);
  if (pcVar14 != (char *)0x0) {
    *pcVar14 = '\0';
    glob_00 = (URLGlob *)calloc(1,0x12f0);
    if (glob_00 != (URLGlob *)0x0) {
      glob_00->urllen = sVar13;
      glob_00->glob_buffer = pcVar14;
      paVar30 = (anon_union_40_3_e2f18bb4_for_content *)0x1;
      CVar24 = CURLE_OK;
      local_264 = 0;
      uVar29 = 1;
      pbVar21 = local_248;
      local_240 = glob;
LAB_0011ae50:
      if ((CVar24 == CURLE_OK) && (*pbVar21 != 0)) {
        pbVar26 = (byte *)glob_00->glob_buffer;
        sVar13 = 0;
        local_290 = pbVar21;
        local_270 = paVar30;
        do {
          while( true ) {
            bVar10 = *local_290;
            if (bVar10 != 0x5b) break;
            pcVar14 = strchr((char *)local_290,0x5d);
            if (((pcVar14 == (char *)0x0) ||
                (pcVar14 = pcVar14 + (1 - (long)local_290), (char *)0x7f < pcVar14)) ||
               (lVar15 = curl_url(), lVar15 == 0)) {
LAB_0011aef0:
              pcVar14 = (char *)0x2;
              if (local_290[1] != 0x5d) goto LAB_0011afa1;
            }
            else {
              memcpy(hostname,local_290,(size_t)pcVar14);
              hostname[(long)pcVar14] = '\0';
              iVar11 = curl_url_set(lVar15,0,hostname,0x200);
              curl_url_cleanup(lVar15);
              if (iVar11 != 0) goto LAB_0011aef0;
              if (pcVar14 == (char *)0x0) goto LAB_0011afa1;
            }
            memcpy(pbVar26,local_290,(size_t)pcVar14);
            pbVar26 = pbVar26 + (long)pcVar14;
            sVar13 = sVar13 + (long)pcVar14;
            local_290 = local_290 + (long)pcVar14;
          }
          if (0x5c < bVar10) {
            if (bVar10 != 0x5d) {
              if (bVar10 == 0x7b) goto LAB_0011afa1;
              if (bVar10 != 0x7d) goto LAB_0011af88;
            }
            pcVar14 = "unmatched close brace/bracket";
            goto LAB_0011b80a;
          }
          if (bVar10 == 0) goto LAB_0011afa1;
          if (bVar10 == 0x5c) {
            pbVar21 = local_290 + 1;
            bVar10 = 0x5c;
            uVar12 = *pbVar21 - 0x5b;
            if ((uVar12 < 0x23) &&
               (bVar10 = 0x5c, (0x500000005U >> ((ulong)uVar12 & 0x3f) & 1) != 0)) {
              local_290 = local_290 + 1;
              local_270 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_270 + 1);
              bVar10 = *pbVar21;
            }
          }
LAB_0011af88:
          local_290 = local_290 + 1;
          *pbVar26 = bVar10;
          pbVar26 = pbVar26 + 1;
          local_270 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_270 + 1);
          sVar13 = sVar13 + 1;
        } while( true );
      }
      if (CVar24 == CURLE_OK) {
        *local_250 = uVar29;
        *local_240 = glob_00;
        return CURLE_OK;
      }
      goto LAB_0011b827;
    }
    free(pcVar14);
  }
  return CURLE_OUT_OF_MEMORY;
LAB_0011afa1:
  pbVar21 = local_290;
  local_2a0 = uVar29;
  if (sVar13 != 0) {
    *pbVar26 = 0;
    sVar2 = glob_00->size;
    pcVar14 = glob_00->glob_buffer;
    glob_00->pattern[sVar2].type = UPTSet;
    glob_00->pattern[sVar2].globindex = -1;
    glob_00->pattern[sVar2].content.NumRange.max_n = 1;
    ppcVar16 = (char **)malloc(8);
    glob_00->pattern[sVar2].content.Set.elements = ppcVar16;
    if (ppcVar16 == (char **)0x0) {
      glob_00->error = "out of memory";
      glob_00->pos = 0;
      CVar24 = CURLE_OUT_OF_MEMORY;
      paVar30 = local_270;
    }
    else {
      __dest = (char *)malloc(sVar13 + 1);
      paVar30 = local_270;
      *ppcVar16 = __dest;
      if (__dest == (char *)0x0) {
        glob_00->error = "out of memory";
        glob_00->pos = 0;
        CVar24 = CURLE_OUT_OF_MEMORY;
      }
      else {
        memcpy(__dest,pcVar14,sVar13);
        __dest[sVar13] = '\0';
        CVar24 = CURLE_OK;
      }
    }
    goto LAB_0011b52d;
  }
  CVar24 = CURLE_OK;
  if (*local_290 != 0x5b) {
    paVar30 = local_270;
    if (*local_290 != 0x7b) goto LAB_0011b52d;
    sVar2 = glob_00->size;
    pbVar21 = (byte *)glob_00->glob_buffer;
    glob_00->pattern[sVar2].type = UPTSet;
    paVar25 = &glob_00->pattern[sVar2].content;
    paVar30 = &glob_00->pattern[sVar2].content;
    (paVar30->Set).elements = (char **)0x0;
    ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar30->Set + 8))->min_c = '\0';
    ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar30->Set + 8))->max_c = '\0';
    ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar30->Set + 8))->ptr_c = '\0';
    ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar30->Set + 8))->field_0x3 = 0;
    ((anon_struct_8_4_a75b1b66_for_CharRange *)((long)&paVar30->Set + 8))->step = 0;
    glob_00->pattern[sVar2].globindex = local_264;
    local_264 = local_264 + 1;
    lVar15 = 1;
    paVar23 = local_270;
    local_280 = paVar25;
LAB_0011b0b1:
    paVar30 = (anon_union_40_3_e2f18bb4_for_content *)((long)paVar23 + 1);
    bVar10 = local_290[lVar15];
    if (bVar10 < 0x5c) {
      uVar29 = local_2a0;
      if (bVar10 != 0x2c) {
        if (bVar10 != 0) {
          if (bVar10 != 0x5b) goto LAB_0011b1eb;
LAB_0011b42d:
          pcVar14 = "nested brace";
          goto LAB_0011b510;
        }
        glob_00->error = "unmatched brace";
        glob_00->pos = (size_t)local_270;
        goto LAB_0011b51e;
      }
LAB_0011b141:
      local_2a0 = uVar29;
      *pbVar21 = 0;
      if ((paVar25->Set).elements == (char **)0x0) {
        ppcVar16 = (char **)malloc(8);
        (paVar25->Set).elements = ppcVar16;
        if (ppcVar16 != (char **)0x0) goto LAB_0011b18c;
LAB_0011b405:
        glob_00->error = "out of memory";
        glob_00->pos = 0;
        CVar24 = CURLE_OUT_OF_MEMORY;
        goto LAB_0011b528;
      }
      ppcVar16 = (char **)realloc((paVar25->Set).elements,
                                  (long)glob_00->pattern[sVar2].content.Set.size * 8 + 8);
      if (ppcVar16 == (char **)0x0) goto LAB_0011b405;
      (local_280->Set).elements = ppcVar16;
LAB_0011b18c:
      pcVar14 = strdup(glob_00->glob_buffer);
      iVar11 = glob_00->pattern[sVar2].content.Set.size;
      ppcVar16[iVar11] = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_0011b405;
      glob_00->pattern[sVar2].content.Set.size = iVar11 + 1;
      if (local_290[lVar15] == 0x7d) {
        pbVar21 = local_290 + lVar15 + 1;
        goto LAB_0011b44e;
      }
      pbVar21 = (byte *)glob_00->glob_buffer;
      paVar25 = local_280;
      paVar23 = paVar30;
    }
    else {
      if (bVar10 < 0x7b) {
        if (bVar10 == 0x5c) {
          bVar10 = local_290[lVar15 + 1];
          if (bVar10 == 0) {
            bVar10 = 0x5c;
          }
          else {
            lVar15 = lVar15 + 1;
            paVar30 = (anon_union_40_3_e2f18bb4_for_content *)((long)paVar23 + 2);
          }
        }
        else if (bVar10 == 0x5d) goto LAB_0011b4f6;
      }
      else {
        if (bVar10 == 0x7d) {
          if (lVar15 == 1) {
            pcVar14 = "empty string within braces";
            goto LAB_0011b510;
          }
          iVar11 = glob_00->pattern[sVar2].content.Set.size + 1;
          if (iVar11 == 0) {
            local_2a0 = 0;
            uVar29 = local_2a0;
            goto LAB_0011b141;
          }
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)iVar11;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_2a0;
          uVar29 = SUB168(auVar3 * auVar6,0);
          if (SUB168(auVar3 * auVar6,8) != 0) {
            glob_00->error = "range overflow";
            glob_00->pos = 0;
            CVar24 = CURLE_URL_MALFORMAT;
            goto LAB_0011b528;
          }
          goto LAB_0011b141;
        }
        if (bVar10 == 0x7b) goto LAB_0011b42d;
      }
LAB_0011b1eb:
      *pbVar21 = bVar10;
      pbVar21 = pbVar21 + 1;
      paVar23 = paVar30;
    }
    lVar15 = lVar15 + 1;
    goto LAB_0011b0b1;
  }
  pbVar26 = local_290 + 1;
  local_280 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_270 + 1);
  pUVar1 = glob_00->pattern + glob_00->size;
  glob_00->pattern[glob_00->size].globindex = local_264;
  local_264 = local_264 + 1;
  iVar11 = Curl_isalpha((uint)local_290[1]);
  local_260 = pUVar1;
  if (iVar11 == 0) {
    iVar11 = Curl_isdigit((uint)*pbVar26);
    pUVar1 = local_260;
    if (iVar11 == 0) {
      glob_00->error = "bad range specification";
      glob_00->pos = (size_t)local_280;
      CVar24 = CURLE_URL_MALFORMAT;
      pbVar21 = pbVar26;
      paVar30 = local_280;
      goto LAB_0011b52d;
    }
    local_260->type = UPTNumRange;
    (local_260->content).NumRange.padlength = 0;
    if ((*pbVar26 == 0x30) && (iVar11 = Curl_isdigit(0x30), iVar11 != 0)) {
      pbVar21 = local_290 + 2;
      do {
        piVar17 = &(pUVar1->content).NumRange.padlength;
        *piVar17 = *piVar17 + 1;
        iVar11 = Curl_isdigit((uint)*pbVar21);
        pbVar21 = pbVar21 + 1;
      } while (iVar11 != 0);
    }
    local_290 = local_290 + 1;
    piVar17 = __errno_location();
    *piVar17 = 0;
    uVar18 = strtoul((char *)local_290,(char **)hostname,10);
    pbVar21 = local_290;
    if (((*piVar17 == 0) && ((byte *)hostname._0_8_ != local_290)) &&
       (pbVar26 = (byte *)hostname._0_8_, *(char *)hostname._0_8_ == '-')) {
      do {
        do {
          pbVar21 = pbVar26 + 1;
          bVar10 = *pbVar21;
          pbVar26 = pbVar21;
        } while (bVar10 == 0x20);
      } while (bVar10 == 9);
      iVar11 = Curl_isdigit((uint)bVar10);
      if (iVar11 == 0) goto LAB_0011b3d3;
      *piVar17 = 0;
      uVar19 = strtoul((char *)pbVar21,(char **)hostname,10);
      if (*piVar17 != 0) goto LAB_0011b3d3;
      if (*(char *)hostname._0_8_ == ':') {
        pbVar21 = (byte *)(hostname._0_8_ + 1);
        *piVar17 = 0;
        uVar22 = strtoul((char *)pbVar21,(char **)hostname,10);
        if (((*piVar17 != 0) || (hostname._0_8_ == 0)) || (*(char *)hostname._0_8_ != ']'))
        goto LAB_0011b3d3;
        pbVar21 = (byte *)(hostname._0_8_ + 1);
        paVar30 = (anon_union_40_3_e2f18bb4_for_content *)
                  ((long)local_280 + ((long)pbVar21 - (long)local_290));
        if ((uVar22 != 0) && (uVar18 != uVar19 || uVar22 == 1)) goto LAB_0011b6e6;
LAB_0011b7cb:
        pcVar14 = "bad range";
      }
      else {
        if (*(char *)hostname._0_8_ != ']') goto LAB_0011b3d3;
        pbVar21 = (byte *)(hostname._0_8_ + 1);
        paVar30 = (anon_union_40_3_e2f18bb4_for_content *)
                  ((long)local_280 + ((long)pbVar21 - (long)local_290));
        uVar22 = 1;
LAB_0011b6e6:
        if (uVar19 == uVar18) {
          uVar20 = 0;
        }
        else {
          uVar20 = uVar19 - uVar18;
          if (uVar19 < uVar18) goto LAB_0011b7cb;
          pcVar14 = "bad range";
          if (uVar20 < uVar22) goto LAB_0011b3ed;
        }
        (local_260->content).NumRange.min_n = uVar18;
        (local_260->content).NumRange.ptr_n = uVar18;
        (local_260->content).NumRange.max_n = uVar19;
        (local_260->content).NumRange.step = uVar22;
        local_2a0 = 0;
        uVar18 = uVar20 / uVar22 + 1;
        if ((uVar18 == 0) ||
           (auVar5._8_8_ = 0, auVar5._0_8_ = uVar18, auVar8._8_8_ = 0, auVar8._0_8_ = uVar29,
           local_2a0 = SUB168(auVar5 * auVar8,0), SUB168(auVar5 * auVar8,8) == 0)) {
LAB_0011b44e:
          CVar24 = CURLE_OK;
          goto LAB_0011b52d;
        }
        pcVar14 = "range overflow";
      }
    }
    else {
LAB_0011b3d3:
      paVar30 = (anon_union_40_3_e2f18bb4_for_content *)
                (pbVar21 + ((long)local_280 - (long)local_290));
      pcVar14 = "bad range";
    }
LAB_0011b3ed:
    glob_00->error = pcVar14;
    glob_00->pos = (size_t)paVar30;
    CVar24 = CURLE_URL_MALFORMAT;
    pbVar21 = local_290;
    local_2a0 = uVar29;
    goto LAB_0011b52d;
  }
  pUVar1->type = UPTCharRange;
  iVar11 = __isoc99_sscanf(pbVar26,"%c-%c%c",&min_c,&max_c,&end_c);
  if (iVar11 == 3) {
    if (end_c != ']') {
      if (end_c == ':') {
        piVar17 = __errno_location();
        *piVar17 = 0;
        uVar18 = strtoul((char *)(local_290 + 5),(char **)hostname,10);
        if ((*piVar17 == 0) && (local_290 + 5 != (byte *)hostname._0_8_)) {
          pbVar21 = (byte *)(hostname._0_8_ + 1);
          if (*(char *)hostname._0_8_ != ']') {
            pbVar21 = pbVar26;
          }
          paVar30 = (anon_union_40_3_e2f18bb4_for_content *)
                    ((long)local_280 + ((long)pbVar21 - (long)pbVar26));
          if (((*(char *)hostname._0_8_ != ']') || (uVar18 - 0x80000000 < 0xffffffff80000001)) ||
             (uVar18 != 1 && min_c == max_c)) goto LAB_0011b62d;
          iVar28 = (int)min_c;
          iVar11 = (int)max_c;
          if (min_c != max_c) goto LAB_0011b628;
          goto LAB_0011b4ac;
        }
      }
      goto LAB_0011b314;
    }
    pbVar21 = local_290 + 5;
    paVar30 = (anon_union_40_3_e2f18bb4_for_content *)((long)local_270 + 5);
    iVar28 = (int)min_c;
    iVar11 = (int)max_c;
    uVar18 = 1;
    if (min_c == max_c) {
LAB_0011b4ac:
      uVar12 = iVar11 - iVar28;
      cVar27 = min_c;
LAB_0011b4b0:
      (local_260->content).CharRange.step = (int)uVar18;
      (local_260->content).CharRange.min_c = min_c;
      (local_260->content).CharRange.ptr_c = min_c;
      (local_260->content).CharRange.max_c = cVar27;
      iVar11 = (int)uVar12 / (int)uVar18 + 1;
      if (iVar11 == 0) {
        local_2a0 = 0;
        goto LAB_0011b52d;
      }
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (long)iVar11;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar29;
      local_2a0 = SUB168(auVar4 * auVar7,0);
      if (SUB168(auVar4 * auVar7,8) == 0) goto LAB_0011b52d;
      pcVar14 = "range overflow";
    }
    else {
LAB_0011b628:
      if (min_c <= max_c) {
        uVar12 = iVar11 - iVar28;
        if ((int)uVar12 < 0x1a) {
          pcVar14 = "bad range";
          cVar27 = max_c;
          if (uVar18 <= uVar12) goto LAB_0011b4b0;
          goto LAB_0011b320;
        }
      }
LAB_0011b62d:
      pcVar14 = "bad range";
    }
  }
  else {
LAB_0011b314:
    pcVar14 = "bad range";
    paVar30 = local_280;
  }
LAB_0011b320:
  glob_00->error = pcVar14;
  glob_00->pos = (size_t)paVar30;
  CVar24 = CURLE_URL_MALFORMAT;
  local_2a0 = uVar29;
  goto LAB_0011b528;
LAB_0011b4f6:
  pcVar14 = "unexpected close bracket";
LAB_0011b510:
  glob_00->error = pcVar14;
  glob_00->pos = (size_t)paVar30;
LAB_0011b51e:
  CVar24 = CURLE_URL_MALFORMAT;
LAB_0011b528:
  local_290 = local_290 + 1;
  pbVar21 = local_290;
LAB_0011b52d:
  uVar18 = glob_00->size + 1;
  glob_00->size = uVar18;
  uVar29 = local_2a0;
  if (99 < uVar18) {
    pcVar14 = "too many globs";
    local_270 = paVar30;
LAB_0011b80a:
    glob_00->error = pcVar14;
    glob_00->pos = (size_t)local_270;
    CVar24 = CURLE_URL_MALFORMAT;
LAB_0011b827:
    pFVar9 = local_258;
    if ((local_258 != (FILE *)0x0) && (pcVar14 = glob_00->error, pcVar14 != (char *)0x0)) {
      sVar2 = glob_00->pos;
      if (sVar2 != 0) {
        curl_msnprintf(hostname,0x200,"%s in URL position %zu:\n%s\n%*s^",pcVar14,sVar2,local_248,
                       (int)sVar2 + -1," ");
        pcVar14 = hostname;
      }
      curl_mfprintf(pFVar9,"curl: (%d) %s\n",CVar24,pcVar14);
    }
    glob_cleanup(glob_00);
    *local_250 = 1;
    return CVar24;
  }
  goto LAB_0011ae50;
}

Assistant:

CURLcode glob_url(struct URLGlob **glob, char *url, unsigned long *urlnum,
                  FILE *error)
{
  /*
   * We can deal with any-size, just make a buffer with the same length
   * as the specified URL!
   */
  struct URLGlob *glob_expand;
  unsigned long amount = 0;
  char *glob_buffer;
  CURLcode res;

  *glob = NULL;

  glob_buffer = malloc(strlen(url) + 1);
  if(!glob_buffer)
    return CURLE_OUT_OF_MEMORY;
  glob_buffer[0] = 0;

  glob_expand = calloc(1, sizeof(struct URLGlob));
  if(!glob_expand) {
    Curl_safefree(glob_buffer);
    return CURLE_OUT_OF_MEMORY;
  }
  glob_expand->urllen = strlen(url);
  glob_expand->glob_buffer = glob_buffer;

  res = glob_parse(glob_expand, url, 1, &amount);
  if(!res)
    *urlnum = amount;
  else {
    if(error && glob_expand->error) {
      char text[512];
      const char *t;
      if(glob_expand->pos) {
        msnprintf(text, sizeof(text), "%s in URL position %zu:\n%s\n%*s^",
                  glob_expand->error,
                  glob_expand->pos, url, (int)glob_expand->pos - 1, " ");
        t = text;
      }
      else
        t = glob_expand->error;

      /* send error description to the error-stream */
      fprintf(error, "curl: (%d) %s\n", res, t);
    }
    /* it failed, we cleanup */
    glob_cleanup(glob_expand);
    *urlnum = 1;
    return res;
  }

  *glob = glob_expand;
  return CURLE_OK;
}